

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_graphics.c
# Opt level: O1

int update(void)

{
  int iVar1;
  
  iVar1 = update_demo_menu(menu);
  if (iVar1 == 0x3e9) {
    iVar1 = 0;
  }
  else if (iVar1 == 1000) {
    iVar1 = 0xb;
  }
  return iVar1;
}

Assistant:

static int update(void)
{
   int ret = update_demo_menu(menu);

   switch (ret) {
      case DEMO_MENU_CONTINUE:
         return id();

      case DEMO_MENU_BACK:
         return DEMO_STATE_OPTIONS;

      default:
         return ret;
   };
}